

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

void __thiscall BigInteger::_divide_by_2(BigInteger *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    bVar5 = 0;
    puVar4 = puVar3;
    do {
      uVar1 = puVar4[-1];
      uVar6 = uVar1 >> 1;
      uVar7 = uVar6 + 500000000;
      if (bVar5 == 0) {
        uVar7 = uVar6;
      }
      puVar4[-1] = uVar7;
      puVar4 = puVar4 + -1;
      bVar5 = (byte)uVar1 & 1;
    } while (puVar4 != puVar2);
    while (puVar3 != puVar2) {
      puVar4 = puVar3 + -1;
      if (*puVar4 != 0) {
        if (puVar3 != puVar2) {
          return;
        }
        break;
      }
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      puVar3 = puVar4;
    }
  }
  this->negative = false;
  return;
}

Assistant:

void BigInteger::_divide_by_2() noexcept
{
    bool carry = false;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        if(carry)
        {
            carry = *i % 2;
            *i = *i / 2 + BLOCK_MOD / 2;
        }
        else
        {
            carry = *i % 2;
            *i /= 2;
        }
    }
    normalize();
}